

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O0

int Res_WinFinalizeRoots(Res_Win_t *p)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Res_Win_t *p_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(p->pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_NodeIsTravIdCurrent(p->pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resWin.c"
                  ,0x159,"int Res_WinFinalizeRoots(Res_Win_t *)");
  }
  Abc_NodeSetTravIdCurrent(p->pNode);
  Vec_PtrClear(p->vRoots);
  Res_WinFinalizeRoots_rec(p->pNode,p->vRoots);
  iVar1 = Vec_PtrSize(p->vRoots);
  if (0 < iVar1) {
    iVar1 = Vec_PtrSize(p->vRoots);
    if ((iVar1 == 1) && (pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vRoots,0), pAVar2 == p->pNode)) {
      return 0;
    }
    return 1;
  }
  __assert_fail("Vec_PtrSize(p->vRoots) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resWin.c"
                ,0x15f,"int Res_WinFinalizeRoots(Res_Win_t *)");
}

Assistant:

int Res_WinFinalizeRoots( Res_Win_t * p )
{
    assert( !Abc_NodeIsTravIdCurrent(p->pNode) );
    // mark the node with the old traversal ID
    Abc_NodeSetTravIdCurrent( p->pNode ); 
    // recollect the roots
    Vec_PtrClear( p->vRoots );
    Res_WinFinalizeRoots_rec( p->pNode, p->vRoots );
    assert( Vec_PtrSize(p->vRoots) > 0 );
    if ( Vec_PtrSize(p->vRoots) == 1 && Vec_PtrEntry(p->vRoots, 0) == p->pNode )
        return 0;
    return 1;
}